

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O2

void __thiscall Nes_Apu::Nes_Apu(Nes_Apu *this)

{
  Synth *this_00;
  
  Blip_Synth<2,_15>::Blip_Synth(&(this->noise).synth);
  Blip_Synth<3,_15>::Blip_Synth(&(this->triangle).synth);
  Blip_Synth<2,_127>::Blip_Synth(&(this->dmc).synth);
  this_00 = &this->square_synth;
  Blip_Synth<3,_15>::Blip_Synth(this_00);
  (this->dmc).apu = this;
  (this->dmc).rom_reader = (_func_int_void_ptr_cpu_addr_t *)0x0;
  (this->square1).synth = this_00;
  (this->square2).synth = this_00;
  this->irq_notifier_ = (_func_void_void_ptr *)0x0;
  this->oscs[0] = (Nes_Osc *)&this->square1;
  this->oscs[1] = (Nes_Osc *)&this->square2;
  this->oscs[2] = &(this->triangle).super_Nes_Osc;
  this->oscs[3] = (Nes_Osc *)&this->noise;
  this->oscs[4] = &(this->dmc).super_Nes_Osc;
  output(this,(Blip_Buffer *)0x0);
  volume(this,1.0);
  reset(this,false,0);
  return;
}

Assistant:

Nes_Apu::Nes_Apu()
{
	dmc.apu = this;
	dmc.rom_reader = NULL;
	square1.synth = &square_synth;
	square2.synth = &square_synth;
	irq_notifier_ = NULL;
	
	oscs [0] = &square1;
	oscs [1] = &square2;
	oscs [2] = &triangle;
	oscs [3] = &noise;
	oscs [4] = &dmc;
	
	output( NULL );
	volume( 1.0 );
	reset( false );
}